

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubDFace::RotateEdgeArray(ON_SubDFace *this,uint fei0)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  undefined1 *memblock;
  ON_SubDEdgePtr *pOVar3;
  uint uVar4;
  uint fei;
  uint uVar5;
  ulong uVar6;
  ON_SubDEdgePtr *pOVar7;
  ON_SubDEdgePtr *pOVar8;
  uint uVar9;
  bool bVar10;
  ON_SubDEdgePtr stack_eptr [8];
  undefined1 auStack_68 [72];
  
  memblock = auStack_68;
  if (fei0 == 0) {
    bVar10 = true;
  }
  else {
    uVar1 = this->m_edge_count;
    if (fei0 < uVar1 && (ushort)(uVar1 - 2) < 0xffef) {
      if (8 < uVar1) {
        memblock = (undefined1 *)onmalloc((ulong)((uint)uVar1 * 8));
      }
      if (memblock != (undefined1 *)0x0) {
        pOVar3 = this->m_edge4;
        pOVar2 = this->m_edgex;
        uVar9 = (uint)uVar1;
        uVar4 = uVar9 + (uVar9 == 0);
        uVar6 = 0;
        pOVar7 = pOVar3;
        do {
          if (uVar6 == 4 && pOVar2 == (ON_SubDEdgePtr *)0x0) {
            bVar10 = false;
            goto LAB_005d86be;
          }
          pOVar8 = pOVar7;
          if (uVar6 == 4) {
            pOVar8 = pOVar2;
          }
          pOVar7 = pOVar8 + 1;
          *(ON__UINT_PTR *)(memblock + uVar6 * 8) = pOVar8->m_ptr;
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
        bVar10 = (uint)uVar1 <= uVar6;
        uVar5 = 0;
        do {
          if (uVar5 == 4) {
            pOVar3 = this->m_edgex;
          }
          pOVar3->m_ptr = *(ON__UINT_PTR *)(memblock + ((ulong)(fei0 + uVar5) % (ulong)uVar9) * 8);
          pOVar3 = pOVar3 + 1;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
LAB_005d86be:
        if (memblock == auStack_68) {
          return bVar10;
        }
        onfree(memblock);
        return bVar10;
      }
    }
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool ON_SubDFace::RotateEdgeArray(
  unsigned int fei0
)
{
  if (0 == fei0)
    return true;

  const unsigned int edge_count = m_edge_count;
  if (edge_count < 2 || edge_count > ON_SubDFace::MaximumEdgeCount || fei0 >= edge_count)
    return false;

  ON_SubDEdgePtr stack_eptr[8];
  ON_SubDEdgePtr* eptr 
    = (edge_count*sizeof(stack_eptr[0]) > sizeof(stack_eptr)) 
    ? ((ON_SubDEdgePtr*)onmalloc(edge_count * sizeof(eptr[0])))
    : stack_eptr;
  if (nullptr == eptr)
    return false;

  ON_SubDEdgePtr* feptr = m_edge4;
  for (unsigned int fei = 0; fei < edge_count; fei++)
  {
    if (4 == fei)
    {
      feptr = m_edgex;
      if (nullptr == feptr)
      {
        if ( eptr != stack_eptr )
          onfree(eptr);  
        return false;
      }
    }
    eptr[fei] = *feptr++;
  }

  feptr = m_edge4;
  for (unsigned int fei = 0; fei < edge_count; fei++)
  {
    if (4 == fei)
      feptr = m_edgex;
    *feptr++ = eptr[(fei + fei0) % edge_count];
  }
  if ( eptr != stack_eptr )
    onfree(eptr);

  return true;
}